

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

void gamma_inc_values(int *n_data,double *a,double *x,double *fx)

{
  double *fx_local;
  double *x_local;
  double *a_local;
  int *n_data_local;
  
  if (*n_data < 0) {
    *n_data = 0;
  }
  *n_data = *n_data + 1;
  if (*n_data < 0x15) {
    *a = gamma_inc_values::a_vec[*n_data + -1];
    *x = gamma_inc_values::x_vec[*n_data + -1];
    *fx = gamma_inc_values::fx_vec[*n_data + -1];
  }
  else {
    *n_data = 0;
    *a = 0.0;
    *x = 0.0;
    *fx = 0.0;
  }
  return;
}

Assistant:

void gamma_inc_values ( int &n_data, double &a, double &x, double &fx )

//****************************************************************************80
//
//  Purpose:
//
//    GAMMA_INC_VALUES returns some values of the incomplete Gamma function.
//
//  Discussion:
//
//    The incomplete Gamma function is defined as:
//
//      Integral ( X <= T < oo ) T^(A-1) * exp(-T) dT.
//
//    In Mathematica, the function can be evaluated by:
//
//      Gamma[A,X]
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    11 April 2010
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//    Stephen Wolfram,
//    The Mathematica Book,
//    Fourth Edition,
//    Cambridge University Press, 1999,
//    ISBN: 0-521-64314-7,
//    LC: QA76.95.W65.
//
//  Parameters:
//
//    Input/output, int &N_DATA.  The user sets N_DATA to 0 before the
//    first call.  On each call, the routine increments N_DATA by 1, and
//    returns the corresponding data; when there is no more data, the
//    output value of N_DATA will be 0 again.
//
//    Output, double &A, the parameter of the function.
//
//    Output, double &X, the argument of the function.
//
//    Output, double &FX, the value of the function.
//
{
# define N_MAX 20

  static double a_vec[N_MAX] = {
     0.10E+00,
     0.10E+00,
     0.10E+00,
     0.50E+00,
     0.50E+00,
     0.50E+00,
     0.10E+01,
     0.10E+01,
     0.10E+01,
     0.11E+01,
     0.11E+01,
     0.11E+01,
     0.20E+01,
     0.20E+01,
     0.20E+01,
     0.60E+01,
     0.60E+01,
     0.11E+02,
     0.26E+02,
     0.41E+02  };

  static double fx_vec[N_MAX] = {
    2.490302836300570E+00,
    0.8718369702247978E+00,
    0.1079213896175866E+00,
    1.238121685818417E+00,
    0.3911298052193973E+00,
    0.01444722098952533E+00,
    0.9048374180359596E+00,
    0.3678794411714423E+00,
    0.006737946999085467E+00,
    0.8827966752611692E+00,
    0.3908330082003269E+00,
    0.008051456628620993E+00,
    0.9898141728888165E+00,
    0.5578254003710746E+00,
    0.007295055724436130E+00,
    114.9574754165633E+00,
    2.440923530031405E+00,
    280854.6620274718E+00,
    8.576480283455533E+24,
    2.085031346403364E+47 };

  static double x_vec[N_MAX] = {
     0.30E-01,
     0.30E+00,
     0.15E+01,
     0.75E-01,
     0.75E+00,
     0.35E+01,
     0.10E+00,
     0.10E+01,
     0.50E+01,
     0.10E+00,
     0.10E+01,
     0.50E+01,
     0.15E+00,
     0.15E+01,
     0.70E+01,
     0.25E+01,
     0.12E+02,
     0.16E+02,
     0.25E+02,
     0.45E+02 };

  if ( n_data < 0 )
  {
    n_data = 0;
  }

  n_data = n_data + 1;

  if ( N_MAX < n_data )
  {
    n_data = 0;
    a = 0.0;
    x = 0.0;
    fx = 0.0;
  }
  else
  {
    a = a_vec[n_data-1];
    x = x_vec[n_data-1];
    fx = fx_vec[n_data-1];
  }

  return;
# undef N_MAX
}